

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeSymbolConstructor
               (DynamicObject *symbolConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *this_00;
  PropertyString *pPVar1;
  RuntimeFunction *pRVar2;
  
  DeferredTypeHandlerBase::Convert(typeHandler,symbolConstructor,mode,0x10,0);
  this = (((symbolConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this_00 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(symbolConstructor,0xd1,0x1000000000000,2,0,0,0);
  (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (symbolConstructor,0x124,(this->super_JavascriptLibraryBase).symbolPrototype.ptr,0,0,0,0
            );
  pPVar1 = ScriptContext::GetPropertyString(this_00,0x166);
  (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(symbolConstructor,0x106,pPVar1,2,0,0,0);
  (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (symbolConstructor,0xb5,(this->super_JavascriptLibraryBase).symbolHasInstance.ptr,0,0,0,
             0);
  if (((this_00->config).threadConfig)->m_ES6IsConcatSpreadable == true) {
    (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (symbolConstructor,0xbf,
               (this->super_JavascriptLibraryBase).symbolIsConcatSpreadable.ptr,0,0,0,0);
  }
  (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (symbolConstructor,0xcb,(this->super_JavascriptLibraryBase).symbolIterator.ptr,0,0,0,0);
  if (((this_00->config).threadConfig)->m_ES2018AsyncIteration == true) {
    (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (symbolConstructor,0x44,(this->super_JavascriptLibraryBase).symbolAsyncIterator.ptr,0,
               0,0,0);
  }
  (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (symbolConstructor,0x154,(this->super_JavascriptLibraryBase).symbolSpecies.ptr,0,0,0,0);
  if (((this_00->config).threadConfig)->m_ES6ToPrimitive == true) {
    (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (symbolConstructor,0x177,(this->super_JavascriptLibraryBase).symbolToPrimitive.ptr,0,0
               ,0,0);
  }
  if (((this_00->config).threadConfig)->m_ES6ToStringTag == true) {
    (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (symbolConstructor,0x179,(this->super_JavascriptLibraryBase).symbolToStringTag.ptr,0,0
               ,0,0);
  }
  (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (symbolConstructor,0x189,(this->super_JavascriptLibraryBase).symbolUnscopables.ptr,0,0,0
             ,0);
  if (((this_00->config).threadConfig)->m_ES6RegExSymbols == true) {
    (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (symbolConstructor,0x101,(this->symbolMatch).ptr,0,0,0,0);
    (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (symbolConstructor,0x133,(this->symbolReplace).ptr,0,0,0,0);
    (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (symbolConstructor,0x13c,(this->symbolSearch).ptr,0,0,0,0);
    (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (symbolConstructor,0x156,(this->symbolSplit).ptr,0,0,0,0);
  }
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptSymbol::EntryInfo::For,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x92);
  (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(symbolConstructor,0x92,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptSymbol::EntryInfo::KeyFor,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xce);
  (*(symbolConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(symbolConstructor,0xce,pRVar2,6,0,0,0);
  DynamicObject::SetHasNoEnumerableProperties(symbolConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSymbolConstructor(DynamicObject* symbolConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(symbolConstructor, mode, 16);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterSymbol
        // so that the update is in sync with profiler
        JavascriptLibrary* library = symbolConstructor->GetLibrary();
        ScriptContext* scriptContext = symbolConstructor->GetScriptContext();
        library->AddMember(symbolConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(0), PropertyConfigurable);
        library->AddMember(symbolConstructor, PropertyIds::prototype, library->symbolPrototype, PropertyNone);
        library->AddMember(symbolConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Symbol), PropertyConfigurable);
        library->AddMember(symbolConstructor, PropertyIds::hasInstance, library->GetSymbolHasInstance(), PropertyNone);
        if (scriptContext->GetConfig()->IsES6IsConcatSpreadableEnabled())
        {
            library->AddMember(symbolConstructor, PropertyIds::isConcatSpreadable, library->GetSymbolIsConcatSpreadable(), PropertyNone);
        }
        library->AddMember(symbolConstructor, PropertyIds::iterator, library->GetSymbolIterator(), PropertyNone);
        if (scriptContext->GetConfig()->IsES2018AsyncIterationEnabled())
        {
            library->AddMember(symbolConstructor, PropertyIds::asyncIterator, library->GetSymbolAsyncIterator(), PropertyNone);
        }

        library->AddMember(symbolConstructor, PropertyIds::species, library->GetSymbolSpecies(), PropertyNone);

        if (scriptContext->GetConfig()->IsES6ToPrimitiveEnabled())
        {
            library->AddMember(symbolConstructor, PropertyIds::toPrimitive, library->GetSymbolToPrimitive(), PropertyNone);
        }

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(symbolConstructor, PropertyIds::toStringTag, library->GetSymbolToStringTag(), PropertyNone);
        }
        library->AddMember(symbolConstructor, PropertyIds::unscopables, library->GetSymbolUnscopables(), PropertyNone);

        if (scriptContext->GetConfig()->IsES6RegExSymbolsEnabled())
        {
            library->AddMember(symbolConstructor, PropertyIds::match, library->GetSymbolMatch(), PropertyNone);
            library->AddMember(symbolConstructor, PropertyIds::replace, library->GetSymbolReplace(), PropertyNone);
            library->AddMember(symbolConstructor, PropertyIds::search, library->GetSymbolSearch(), PropertyNone);
            library->AddMember(symbolConstructor, PropertyIds::split, library->GetSymbolSplit(), PropertyNone);
        }

        library->AddFunctionToLibraryObject(symbolConstructor, PropertyIds::for_, &JavascriptSymbol::EntryInfo::For, 1);
        library->AddFunctionToLibraryObject(symbolConstructor, PropertyIds::keyFor, &JavascriptSymbol::EntryInfo::KeyFor, 1);

        symbolConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }